

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uchar *data;
  ulong uVar14;
  secp256k1_fe *b;
  uchar *seckey;
  secp256k1_ecmult_gen_context *a;
  secp256k1_ecmult_gen_context *a_00;
  uint uVar15;
  undefined1 *puVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  secp256k1_ecmult_gen_context *a_01;
  secp256k1_ecmult_gen_context *psVar23;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  secp256k1_ecmult_gen_context *r_00;
  secp256k1_ecmult_gen_context *psVar27;
  secp256k1_ecmult_gen_context *r_01;
  secp256k1_ecmult_gen_context *a_02;
  undefined1 auVar28 [16];
  secp256k1_fe x;
  secp256k1_fe u;
  secp256k1_fe r;
  uchar branch_hash [32];
  secp256k1_scalar asStack_3bc [17];
  secp256k1_ge sStack_378;
  secp256k1_sha256 sStack_310;
  secp256k1_fe sStack_2a8;
  secp256k1_ecmult_gen_context *psStack_278;
  secp256k1_ecmult_gen_context *psStack_270;
  undefined8 uStack_268;
  secp256k1_ecmult_gen_context *psStack_260;
  secp256k1_ecmult_gen_context *psStack_258;
  code *pcStack_250;
  undefined1 local_248 [56];
  ulong uStack_210;
  undefined1 *local_208;
  ulong uStack_200;
  uchar *local_1f8;
  ulong uStack_1f0;
  uint local_1dc;
  undefined1 local_1d8 [56];
  uint64_t uStack_1a0;
  uint64_t local_198;
  uint64_t uStack_190;
  uchar *local_188;
  uint64_t uStack_180;
  undefined1 local_178 [56];
  uint64_t uStack_140;
  uint64_t local_138;
  uint64_t uStack_130;
  uchar *local_128;
  int local_120;
  undefined4 local_11c;
  secp256k1_sha256 *local_118;
  secp256k1_ecmult_gen_context *local_110;
  ulong local_108;
  secp256k1_ecmult_gen_context *local_100;
  secp256k1_ecmult_gen_context *local_f8;
  ulong local_f0;
  undefined1 local_e8 [104];
  long local_80;
  uint64_t local_78;
  uint64_t local_70;
  ulong local_68;
  byte local_58 [40];
  undefined1 *puVar16;
  
  a = (secp256k1_ecmult_gen_context *)local_248;
  puVar18 = local_248;
  puVar19 = local_248;
  puVar20 = local_248;
  puVar17 = local_248;
  puVar21 = local_248;
  puVar22 = local_248;
  psVar23 = (secp256k1_ecmult_gen_context *)local_248;
  local_110 = (secp256k1_ecmult_gen_context *)p;
  local_100 = (secp256k1_ecmult_gen_context *)t;
  local_f8 = (secp256k1_ecmult_gen_context *)u32;
  a_00 = (secp256k1_ecmult_gen_context *)local_178;
  a_02 = (secp256k1_ecmult_gen_context *)(local_248 + 0x30);
  uVar14 = 0;
  local_118 = hasher;
  uVar12 = 0;
LAB_0010f965:
  iVar11 = (int)uVar12;
  if (iVar11 == 0) {
    pcStack_250 = (code *)0x10f97c;
    secp256k1_ellswift_prng(local_58,local_118,(uint32_t)uVar14);
    iVar11 = 0x40;
    uVar14 = (ulong)((uint32_t)uVar14 + 1);
  }
  r_00 = local_f8;
  local_108 = (ulong)(iVar11 - 1U);
  bVar3 = local_58[iVar11 - 1U >> 1];
  pcStack_250 = (code *)0x10f9ba;
  local_f0 = uVar14;
  secp256k1_ellswift_prng((uchar *)local_f8,local_118,(uint32_t)uVar14);
  r_01 = (secp256k1_ecmult_gen_context *)local_e8;
  pcStack_250 = (code *)0x10f9cd;
  secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r_01,(uchar *)r_00);
  local_e8._40_8_ = 1;
  pcStack_250 = (code *)0x10f9e1;
  secp256k1_fe_verify((secp256k1_fe *)r_01);
  pcStack_250 = (code *)0x10f9e9;
  secp256k1_fe_verify((secp256k1_fe *)r_01);
  uVar12 = ((ulong)local_e8._32_8_ >> 0x30) * 0x1000003d1 + local_e8._0_8_;
  if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
    uVar14 = (uVar12 >> 0x34) + local_e8._8_8_;
    a_01 = (secp256k1_ecmult_gen_context *)((uVar14 >> 0x34) + local_e8._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_01 >> 0x34) + local_e8._24_8_);
    uVar25 = ((ulong)ecmult_gen_ctx >> 0x34) + (local_e8._32_8_ & 0xffffffffffff);
    data = (uchar *)((uVar14 | uVar12 | (ulong)a_01 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                    uVar25);
    if ((data != (uchar *)0x0) &&
       (data = (uchar *)0x1000003d1,
       (uVar12 + 0x1000003d0 & uVar14 & (ulong)a_01 & (ulong)ecmult_gen_ctx &
       (uVar25 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0010faba;
    pcStack_250 = (code *)0x110851;
    secp256k1_ellswift_elligatorswift_var_cold_1();
    puVar16 = (undefined1 *)(ulong)bVar3;
LAB_00110851:
    puVar18 = puVar16;
    pcStack_250 = (code *)0x110856;
    secp256k1_ellswift_elligatorswift_var_cold_15();
LAB_00110856:
    pcStack_250 = (code *)0x11085b;
    secp256k1_ellswift_elligatorswift_var_cold_7();
    puVar16 = puVar18;
LAB_0011085b:
    puVar19 = puVar16;
    pcStack_250 = (code *)0x110860;
    secp256k1_ellswift_elligatorswift_var_cold_14();
LAB_00110860:
    pcStack_250 = (code *)0x110865;
    secp256k1_ellswift_elligatorswift_var_cold_6();
    puVar20 = puVar19;
LAB_00110865:
    pcStack_250 = (code *)0x11086a;
    secp256k1_ellswift_elligatorswift_var_cold_5();
    puVar17 = puVar20;
LAB_0011086a:
    pcStack_250 = (code *)0x11086f;
    secp256k1_ellswift_elligatorswift_var_cold_4();
    goto LAB_0011086f;
  }
LAB_0010faba:
  bVar3 = bVar3 >> ((char)local_108 * '\x04' & 4U);
  uVar15 = (uint)bVar3;
  puVar16 = (undefined1 *)(ulong)uVar15;
  local_1d8._48_4_ = local_110->built;
  local_1d8._52_4_ = local_110->scalar_offset;
  uStack_1a0 = (local_110->ge_offset).x.n[0];
  local_198 = (local_110->ge_offset).x.n[1];
  uStack_190 = (local_110->ge_offset).x.n[2];
  local_188 = (uchar *)(local_110->ge_offset).x.n[3];
  uStack_180 = (local_110->ge_offset).x.n[4];
  local_178._32_8_ = local_e8._32_8_;
  local_178._40_8_ = local_e8._40_8_;
  local_178._16_8_ = local_e8._16_8_;
  local_178._24_8_ = local_e8._24_8_;
  local_178._0_8_ = local_e8._0_8_;
  local_178._8_8_ = local_e8._8_8_;
  r_01 = (secp256k1_ecmult_gen_context *)(local_1d8 + 0x30);
  pcStack_250 = (code *)0x10fb39;
  secp256k1_fe_verify((secp256k1_fe *)r_01);
  local_1d8._48_8_ = ((ulong)local_188 >> 0x30) * 0x1000003d1 + local_1d8._48_8_;
  uVar12 = ((ulong)local_1d8._48_8_ >> 0x34) + uStack_1a0;
  uVar14 = (uVar12 >> 0x34) + local_198;
  uVar25 = (uVar14 >> 0x34) + uStack_190;
  uStack_190 = uVar25 & 0xfffffffffffff;
  local_188 = (uchar *)((uVar25 >> 0x34) + ((ulong)local_188 & 0xffffffffffff));
  local_198 = uVar14 & 0xfffffffffffff;
  uStack_1a0 = uVar12 & 0xfffffffffffff;
  local_1d8._48_8_ = local_1d8._48_8_ & 0xfffffffffffff;
  uStack_180 = CONCAT44(uStack_180._4_4_,1);
  pcStack_250 = (code *)0x10fbed;
  secp256k1_fe_verify((secp256k1_fe *)r_01);
  pcStack_250 = (code *)0x10fbf5;
  secp256k1_fe_verify((secp256k1_fe *)a_00);
  local_178._0_8_ = ((ulong)local_178._32_8_ >> 0x30) * 0x1000003d1 + local_178._0_8_;
  local_178._8_8_ = ((ulong)local_178._0_8_ >> 0x34) + local_178._8_8_;
  uVar12 = ((ulong)local_178._8_8_ >> 0x34) + local_178._16_8_;
  uVar14 = (uVar12 >> 0x34) + local_178._24_8_;
  local_178._24_8_ = uVar14 & 0xfffffffffffff;
  data = (uchar *)(local_178._32_8_ & 0xffffffffffff);
  local_178._32_8_ = data + (uVar14 >> 0x34);
  a_01 = (secp256k1_ecmult_gen_context *)(uVar12 & 0xfffffffffffff);
  local_178._8_8_ = local_178._8_8_ & 0xfffffffffffff;
  local_178._0_8_ = local_178._0_8_ & 0xfffffffffffff;
  local_178._40_4_ = 1;
  pcStack_250 = (code *)0x10fc9f;
  local_178._16_8_ = a_01;
  secp256k1_fe_verify((secp256k1_fe *)a_00);
  pcStack_250 = (code *)0x10fca7;
  ecmult_gen_ctx = r_01;
  iVar11 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)r_01);
  r_00 = (secp256k1_ecmult_gen_context *)0xfffffffffffff;
  if (iVar11 == 0) goto LAB_00110851;
  local_1dc = uVar15;
  if ((bVar3 & 2) != 0) {
    pcStack_250 = (code *)0x10ffeb;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    a_01 = (secp256k1_ecmult_gen_context *)0x1;
    pcStack_250 = (code *)0x10fffc;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_178._40_8_ & 0xffffffff),1);
    local_248._48_8_ = 0x3ffffbfffff0bc - local_178._0_8_;
    uStack_210 = 0x3ffffffffffffc - local_178._8_8_;
    local_208 = (undefined1 *)(0x3ffffffffffffc - local_178._16_8_);
    uStack_200 = 0x3ffffffffffffc - local_178._24_8_;
    local_1f8 = (uchar *)(0x3fffffffffffc - local_178._32_8_);
    uStack_1f0 = 2;
    pcStack_250 = (code *)0x110052;
    secp256k1_fe_verify((secp256k1_fe *)a_02);
    local_248._32_8_ = local_1f8;
    local_248._40_8_ = uStack_1f0;
    local_248._16_8_ = local_208;
    local_248._24_8_ = uStack_200;
    local_248._0_8_ = local_248._48_8_;
    local_248._8_8_ = uStack_210;
    pcStack_250 = (code *)0x11007c;
    secp256k1_fe_verify((secp256k1_fe *)local_248);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(local_1d8 + 0x30);
    pcStack_250 = (code *)0x110089;
    secp256k1_fe_verify((secp256k1_fe *)ecmult_gen_ctx);
    r_00 = (secp256k1_ecmult_gen_context *)(local_178 + 0x30);
    if (0x20 < (int)uStack_180 + local_248._40_4_) goto LAB_00110856;
    local_248._0_8_ = local_248._0_8_ + local_1d8._48_8_;
    local_248._8_8_ = local_248._8_8_ + uStack_1a0;
    local_248._16_8_ = local_248._16_8_ + local_198;
    local_248._24_8_ = local_248._24_8_ + uStack_190;
    local_248._32_8_ = local_248._32_8_ + (long)local_188;
    local_248._44_4_ = 0;
    local_248._40_4_ = (int)uStack_180 + local_248._40_4_;
    pcStack_250 = (code *)0x1100ee;
    data = local_188;
    secp256k1_fe_verify((secp256k1_fe *)local_248);
    pcStack_250 = (code *)0x1100f6;
    iVar11 = secp256k1_fe_is_square_var((secp256k1_fe *)local_248);
    if (iVar11 == 0) goto LAB_00110535;
    pcStack_250 = (code *)0x110109;
    secp256k1_fe_sqr((secp256k1_fe *)r_00,(secp256k1_fe *)a_00);
    r_01 = (secp256k1_ecmult_gen_context *)local_1d8;
    pcStack_250 = (code *)0x11011c;
    a_01 = (secp256k1_ecmult_gen_context *)local_248;
    secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)local_248,(secp256k1_fe *)r_00);
    pcStack_250 = (code *)0x110124;
    ecmult_gen_ctx = r_01;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    if (10 < (int)local_1d8._40_4_) goto LAB_00110860;
    local_1d8._0_8_ = local_1d8._0_8_ * 3;
    local_1d8._8_8_ = local_1d8._8_8_ * 3;
    local_1d8._16_8_ = local_1d8._16_8_ * 3;
    local_1d8._24_8_ = local_1d8._24_8_ * 3;
    data = (uchar *)(local_1d8._32_8_ * 3);
    local_1d8._44_4_ = 0;
    local_1d8._40_4_ = local_1d8._40_4_ * 3;
    pcStack_250 = (code *)0x1101a9;
    local_1d8._32_8_ = data;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    pcStack_250 = (code *)0x1101b7;
    a_01 = r_00;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,(secp256k1_fe *)a_00);
    pcStack_250 = (code *)0x1101bf;
    ecmult_gen_ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (8 < local_120) goto LAB_00110865;
    local_178._48_8_ = local_178._48_8_ << 2;
    uStack_140 = uStack_140 << 2;
    local_138 = local_138 << 2;
    uStack_130 = uStack_130 << 2;
    local_128 = (uchar *)((long)local_128 << 2);
    local_120 = local_120 << 2;
    local_11c = 0;
    pcStack_250 = (code *)0x110228;
    secp256k1_fe_verify((secp256k1_fe *)(local_178 + 0x30));
    pcStack_250 = (code *)0x110235;
    secp256k1_fe_verify((secp256k1_fe *)(local_178 + 0x30));
    local_178._48_8_ = local_178._48_8_ + 8;
    local_120 = local_120 + 1;
    local_11c = 0;
    r_00 = (secp256k1_ecmult_gen_context *)(local_178 + 0x30);
    pcStack_250 = (code *)0x11025d;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    pcStack_250 = (code *)0x110265;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    pcStack_250 = (code *)0x11026d;
    ecmult_gen_ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (0x20 < local_120 + local_1d8._40_4_) goto LAB_0011086a;
    local_1d8._0_8_ = local_1d8._0_8_ + local_178._48_8_;
    local_1d8._8_8_ = local_1d8._8_8_ + uStack_140;
    local_1d8._16_8_ = local_1d8._16_8_ + local_138;
    local_1d8._24_8_ = local_1d8._24_8_ + uStack_130;
    local_1d8._32_8_ = local_1d8._32_8_ + (long)local_128;
    local_1d8._44_4_ = 0;
    local_1d8._40_4_ = local_120 + local_1d8._40_4_;
    pcStack_250 = (code *)0x1102de;
    data = local_128;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    pcStack_250 = (code *)0x1102ec;
    secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)r_01,(secp256k1_fe *)local_248);
    pcStack_250 = (code *)0x1102f4;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    pcStack_250 = (code *)0x110305;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_1d8._40_8_ & 0xffffffff),1);
    local_1d8._0_8_ = 0x3ffffbfffff0bc - local_1d8._0_8_;
    local_1d8._8_8_ = 0x3ffffffffffffc - local_1d8._8_8_;
    local_1d8._16_8_ = 0x3ffffffffffffc - local_1d8._16_8_;
    local_1d8._24_8_ = 0x3ffffffffffffc - local_1d8._24_8_;
    local_1d8._32_8_ = 0x3fffffffffffc - local_1d8._32_8_;
    local_1d8._40_8_ = 2;
    pcStack_250 = (code *)0x110361;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    pcStack_250 = (code *)0x110369;
    iVar11 = secp256k1_fe_is_square_var((secp256k1_fe *)r_01);
    if (iVar11 != 0) {
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(local_e8 + 0x60);
      a_01 = (secp256k1_ecmult_gen_context *)local_1d8;
      pcStack_250 = (code *)0x110383;
      iVar11 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)a_01);
      if (iVar11 == 0) goto LAB_00110883;
      if ((local_1dc & 1) != 0) {
        pcStack_250 = (code *)0x1103a3;
        secp256k1_fe_verify((secp256k1_fe *)(local_e8 + 0x60));
        uVar12 = (local_68 >> 0x30) * 0x1000003d1 + local_e8._96_8_;
        if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
          uVar14 = (uVar12 >> 0x34) + local_80;
          uVar25 = (uVar14 >> 0x34) + local_78;
          uVar24 = (uVar25 >> 0x34) + local_70;
          uVar26 = (uVar24 >> 0x34) + (local_68 & 0xffffffffffff);
          if ((((uVar14 | uVar12 | uVar25 | uVar24) & 0xfffffffffffff) == 0 && uVar26 == 0) ||
             ((uVar12 + 0x1000003d0 & uVar14 & uVar25 & uVar24 & (uVar26 ^ 0xf000000000000)) ==
              0xfffffffffffff)) goto LAB_00110535;
        }
      }
      pcStack_250 = (code *)0x11047c;
      secp256k1_fe_verify((secp256k1_fe *)local_248);
      uVar12 = ((ulong)local_248._32_8_ >> 0x30) * 0x1000003d1 + local_248._0_8_;
      if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) ||
         (data = (uchar *)local_248._32_8_, (uVar12 & 0xfffffffffffff) == 0)) {
        uVar14 = (uVar12 >> 0x34) + local_248._8_8_;
        uVar25 = (uVar14 >> 0x34) + local_248._16_8_;
        uVar24 = (uVar25 >> 0x34) + local_248._24_8_;
        uVar26 = (uVar24 >> 0x34) + (local_248._32_8_ & 0xffffffffffff);
        if ((((uVar14 | uVar12 | uVar25 | uVar24) & 0xfffffffffffff) == 0 && uVar26 == 0) ||
           (data = (uchar *)0x1000003d1,
           (uVar12 + 0x1000003d0 & uVar14 & uVar25 & uVar24 & (uVar26 ^ 0xf000000000000)) ==
           0xfffffffffffff)) goto LAB_00110535;
      }
      a_00 = (secp256k1_ecmult_gen_context *)(local_e8 + 0x30);
      pcStack_250 = (code *)0x110567;
      secp256k1_fe_inv_var((secp256k1_fe *)a_00,(secp256k1_fe *)local_248);
      pcStack_250 = (code *)0x11057a;
      a_01 = a_00;
      secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_00,(secp256k1_fe *)(local_e8 + 0x60));
      pcStack_250 = (code *)0x110582;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      a_02 = (secp256k1_ecmult_gen_context *)(local_248 + 0x30);
      pcStack_250 = (code *)0x11058f;
      ecmult_gen_ctx = a_02;
      secp256k1_fe_verify((secp256k1_fe *)a_02);
      if (0x20 < (int)uStack_1f0 + local_e8._88_4_) goto LAB_00110888;
      a = (secp256k1_ecmult_gen_context *)(local_e8 + 0x30);
      local_e8._48_8_ = local_e8._48_8_ + local_248._48_8_;
      local_e8._56_8_ = local_e8._56_8_ + uStack_210;
      local_e8._64_8_ = local_e8._64_8_ + (long)local_208;
      local_e8._72_8_ = local_e8._72_8_ + uStack_200;
      local_e8._80_8_ = local_e8._80_8_ + (long)local_1f8;
      local_e8._92_4_ = 0;
      local_e8._88_4_ = (int)uStack_1f0 + local_e8._88_4_;
      pcStack_250 = (code *)0x1105e0;
      data = local_1f8;
      secp256k1_fe_verify((secp256k1_fe *)a);
      pcStack_250 = (code *)0x1105e8;
      secp256k1_fe_half((secp256k1_fe *)a);
      psVar27 = r_01;
      goto LAB_001105e8;
    }
LAB_00110535:
    uVar14 = (ulong)((int)local_f0 + 1);
    uVar12 = local_108;
    goto LAB_0010f965;
  }
  local_1f8 = local_188;
  uStack_1f0 = uStack_180;
  local_208 = (undefined1 *)local_198;
  uStack_200 = uStack_190;
  local_248._48_8_ = local_1d8._48_8_;
  uStack_210 = uStack_1a0;
  pcStack_250 = (code *)0x10fcee;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  pcStack_250 = (code *)0x10fcf6;
  ecmult_gen_ctx = a_00;
  secp256k1_fe_verify((secp256k1_fe *)a_00);
  r_00 = (secp256k1_ecmult_gen_context *)(local_178 + 0x30);
  r_01 = (secp256k1_ecmult_gen_context *)local_248;
  if (0x20 < local_178._40_4_ + (int)uStack_1f0) goto LAB_0011085b;
  local_248._48_8_ = local_248._48_8_ + local_178._0_8_;
  uStack_210 = uStack_210 + local_178._8_8_;
  local_208 = (undefined1 *)
              ((long)(((secp256k1_ge *)(local_178._16_8_ + 8))->x).n + ((long)local_208 - 8U));
  uStack_200 = uStack_200 + local_178._24_8_;
  local_1f8 = local_1f8 + local_178._32_8_;
  uStack_1f0 = (ulong)(uint)(local_178._40_4_ + (int)uStack_1f0);
  pcStack_250 = (code *)0x10fd60;
  data = (uchar *)local_178._32_8_;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  pcStack_250 = (code *)0x10fd68;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  pcStack_250 = (code *)0x10fd76;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(uStack_1f0 & 0xffffffff),2);
  local_248._48_8_ = 0x5ffff9ffffe91a - local_248._48_8_;
  uStack_210 = 0x5ffffffffffffa - uStack_210;
  local_208 = (undefined1 *)(0x5ffffffffffffa - (long)local_208);
  uStack_200 = 0x5ffffffffffffa - uStack_200;
  local_1f8 = (uchar *)(0x5fffffffffffa - (long)local_1f8);
  uStack_1f0 = 3;
  pcStack_250 = (code *)0x10fdc3;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  pcStack_250 = (code *)0x10fdcb;
  iVar11 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)a_02);
  if (iVar11 != 0) goto LAB_00110535;
  pcStack_250 = (code *)0x10fdde;
  secp256k1_fe_sqr((secp256k1_fe *)local_248,(secp256k1_fe *)a_02);
  pcStack_250 = (code *)0x10fde6;
  secp256k1_fe_verify((secp256k1_fe *)local_248);
  pcStack_250 = (code *)0x10fdf4;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_248._40_8_ & 0xffffffff),1);
  local_248._0_8_ = 0x3ffffbfffff0bc - local_248._0_8_;
  local_248._8_8_ = 0x3ffffffffffffc - local_248._8_8_;
  local_248._16_8_ = 0x3ffffffffffffc - local_248._16_8_;
  local_248._24_8_ = 0x3ffffffffffffc - local_248._24_8_;
  local_248._32_8_ = 0x3fffffffffffc - local_248._32_8_;
  local_248._40_8_ = 2;
  pcStack_250 = (code *)0x10fe3f;
  secp256k1_fe_verify((secp256k1_fe *)local_248);
  pcStack_250 = (code *)0x10fe52;
  a_01 = a_00;
  secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_00,(secp256k1_fe *)(local_1d8 + 0x30));
  pcStack_250 = (code *)0x10fe5a;
  secp256k1_fe_verify((secp256k1_fe *)local_248);
  pcStack_250 = (code *)0x10fe62;
  ecmult_gen_ctx = a_02;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  r_01 = (secp256k1_ecmult_gen_context *)local_248;
  if (0x20 < (int)uStack_1f0 + local_248._40_4_) goto LAB_0011088d;
  local_248._0_8_ = local_248._0_8_ + local_248._48_8_;
  local_248._8_8_ = local_248._8_8_ + uStack_210;
  local_248._16_8_ = local_248._16_8_ + (long)local_208;
  local_248._24_8_ = local_248._24_8_ + uStack_200;
  local_248._32_8_ = local_248._32_8_ + (long)local_1f8;
  local_248._44_4_ = 0;
  local_248._40_4_ = (int)uStack_1f0 + local_248._40_4_;
  pcStack_250 = (code *)0x10feb3;
  secp256k1_fe_verify((secp256k1_fe *)local_248);
  pcStack_250 = (code *)0x10febb;
  secp256k1_fe_verify((secp256k1_fe *)local_248);
  uVar12 = ((ulong)local_248._32_8_ >> 0x30) * 0x1000003d1 + local_248._0_8_;
  if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) ||
     (data = (uchar *)local_248._32_8_, (uVar12 & 0xfffffffffffff) == 0)) {
    uVar14 = (uVar12 >> 0x34) + local_248._8_8_;
    a_01 = (secp256k1_ecmult_gen_context *)((uVar14 >> 0x34) + local_248._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_01 >> 0x34) + local_248._24_8_);
    uVar25 = ((ulong)ecmult_gen_ctx >> 0x34) + (local_248._32_8_ & 0xffffffffffff);
    data = (uchar *)((uVar14 | uVar12 | (ulong)a_01 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                    uVar25);
    r_01 = (secp256k1_ecmult_gen_context *)local_248;
    if ((data == (uchar *)0x0) ||
       (data = (uchar *)0x1000003d1, r_01 = (secp256k1_ecmult_gen_context *)local_248,
       (uVar12 + 0x1000003d0 & uVar14 & (ulong)a_01 & (ulong)ecmult_gen_ctx &
       (uVar25 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00110892;
  }
  pcStack_250 = (code *)0x10ff87;
  secp256k1_fe_sqr((secp256k1_fe *)r_00,(secp256k1_fe *)a_00);
  pcStack_250 = (code *)0x10ff95;
  secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,(secp256k1_fe *)a_00);
  pcStack_250 = (code *)0x10ff9d;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  local_178._48_8_ = local_178._48_8_ + 2;
  local_120 = local_120 + 1;
  local_11c = 0;
  pcStack_250 = (code *)0x10ffc0;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  pcStack_250 = (code *)0x10ffce;
  secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)local_248,(secp256k1_fe *)r_00);
  pcStack_250 = (code *)0x10ffd6;
  iVar11 = secp256k1_fe_is_square_var((secp256k1_fe *)a_02);
  if (iVar11 == 0) goto LAB_00110535;
  pcStack_250 = (code *)0x1107fe;
  secp256k1_fe_inv_var((secp256k1_fe *)local_248,(secp256k1_fe *)local_248);
  pcStack_250 = (code *)0x110811;
  secp256k1_fe_mul((secp256k1_fe *)local_248,(secp256k1_fe *)local_248,
                   (secp256k1_fe *)(local_178 + 0x30));
  local_e8._48_8_ = local_1d8._48_8_;
  local_e8._56_8_ = uStack_1a0;
  local_e8._64_8_ = local_198;
  local_e8._72_8_ = uStack_190;
  local_e8._80_8_ = local_188;
  local_e8._88_8_ = uStack_180;
  psVar27 = (secp256k1_ecmult_gen_context *)local_248;
LAB_001105e8:
  r_00 = (secp256k1_ecmult_gen_context *)(local_178 + 0x30);
  ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(local_248 + 0x30);
  pcStack_250 = (code *)0x1105f5;
  iVar11 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)local_248);
  uVar15 = local_1dc;
  puVar17 = (undefined1 *)(ulong)local_1dc;
  a_00 = a;
  a_01 = psVar23;
  r_01 = psVar27;
  if (iVar11 == 0) {
LAB_0011086f:
    a_02 = (secp256k1_ecmult_gen_context *)(local_248 + 0x30);
    pcStack_250 = (code *)0x110874;
    secp256k1_ellswift_elligatorswift_var_cold_12();
LAB_00110874:
    pcStack_250 = (code *)0x110879;
    secp256k1_ellswift_elligatorswift_var_cold_11();
    psVar27 = r_01;
  }
  else {
    if (((local_1dc & 5) == 5) || ((local_1dc & 5) == 0)) {
      pcStack_250 = (code *)0x11061c;
      secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
      pcStack_250 = (code *)0x110629;
      secp256k1_fe_verify_magnitude((secp256k1_fe *)(uStack_1f0 & 0xffffffff),1);
      local_248._48_8_ = 0x3ffffbfffff0bc - local_248._48_8_;
      uStack_210 = 0x3ffffffffffffc - uStack_210;
      local_208 = (undefined1 *)(0x3ffffffffffffc - (long)local_208);
      uStack_200 = 0x3ffffffffffffc - uStack_200;
      local_1f8 = (uchar *)(0x3fffffffffffc - (long)local_1f8);
      uStack_1f0 = 2;
      pcStack_250 = (code *)0x11066d;
      secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
    }
    b = &secp256k1_ellswift_c4;
    if ((uVar15 & 1) == 0) {
      b = &secp256k1_ellswift_c3;
    }
    a_00 = (secp256k1_ecmult_gen_context *)local_178;
    pcStack_250 = (code *)0x110696;
    a_01 = a_00;
    secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_00,b);
    pcStack_250 = (code *)0x11069e;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    a_02 = (secp256k1_ecmult_gen_context *)(local_e8 + 0x30);
    pcStack_250 = (code *)0x1106ae;
    ecmult_gen_ctx = a_02;
    secp256k1_fe_verify((secp256k1_fe *)a_02);
    if (0x20 < (int)(local_e8._88_4_ + local_178._40_4_)) goto LAB_00110874;
    a_00 = (secp256k1_ecmult_gen_context *)local_178;
    local_178._0_8_ = local_178._0_8_ + local_e8._48_8_;
    local_178._8_8_ = local_178._8_8_ + local_e8._56_8_;
    local_178._16_8_ = (long)(((secp256k1_ge *)(local_178._16_8_ + 8))->x).n + (local_e8._64_8_ - 8)
    ;
    local_178._24_8_ = local_178._24_8_ + local_e8._72_8_;
    local_178._32_8_ = local_178._32_8_ + local_e8._80_8_;
    local_178._44_4_ = 0;
    local_178._40_4_ = local_e8._88_4_ + local_178._40_4_;
    pcStack_250 = (code *)0x110708;
    data = (uchar *)local_e8._80_8_;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    r_00 = local_100;
    a_01 = (secp256k1_ecmult_gen_context *)(local_248 + 0x30);
    pcStack_250 = (code *)0x110720;
    secp256k1_fe_mul((secp256k1_fe *)local_100,(secp256k1_fe *)a_01,(secp256k1_fe *)a_00);
    pcStack_250 = (code *)0x110728;
    secp256k1_fe_normalize_var((secp256k1_fe *)r_00);
    pcStack_250 = (code *)0x110730;
    ecmult_gen_ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    r_01 = local_110;
    if (*(int *)((long)(r_00->ge_offset).x.n + 0x24) != 0) {
      a_02 = *(secp256k1_ecmult_gen_context **)r_00;
      a_00 = (secp256k1_ecmult_gen_context *)&(local_110->ge_offset).x.magnitude;
      pcStack_250 = (code *)0x110754;
      ecmult_gen_ctx = a_00;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      puVar21 = puVar17;
      if (*(int *)((long)(r_01->ge_offset).y.n + 0x24) != 0) {
        if ((((uint)a_02 ^ *(uint *)a_00) & 1) != 0) {
          pcStack_250 = (code *)0x110770;
          secp256k1_fe_verify((secp256k1_fe *)r_00);
          pcStack_250 = (code *)0x11077f;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(r_00->ge_offset).x.n[4],1);
          uVar4 = (r_00->ge_offset).x.n[0];
          uVar5 = (r_00->ge_offset).x.n[1];
          uVar6 = (r_00->ge_offset).x.n[2];
          *(long *)r_00 = 0x3ffffbfffff0bc - *(long *)r_00;
          (r_00->ge_offset).x.n[0] = 0x3ffffffffffffc - uVar4;
          (r_00->ge_offset).x.n[1] = 0x3ffffffffffffc - uVar5;
          (r_00->ge_offset).x.n[2] = 0x3ffffffffffffc - uVar6;
          (r_00->ge_offset).x.n[3] = 0x3fffffffffffc - (r_00->ge_offset).x.n[3];
          (r_00->ge_offset).x.n[4] = 2;
          pcStack_250 = (code *)0x1107d6;
          secp256k1_fe_verify((secp256k1_fe *)r_00);
          pcStack_250 = (code *)0x1107de;
          secp256k1_fe_normalize_var((secp256k1_fe *)r_00);
        }
        return;
      }
      goto LAB_0011087e;
    }
  }
  r_01 = psVar27;
  pcStack_250 = (code *)0x11087e;
  secp256k1_ellswift_elligatorswift_var_cold_10();
  puVar21 = puVar17;
LAB_0011087e:
  pcStack_250 = (code *)0x110883;
  secp256k1_ellswift_elligatorswift_var_cold_9();
LAB_00110883:
  pcStack_250 = (code *)0x110888;
  secp256k1_ellswift_elligatorswift_var_cold_3();
  puVar22 = puVar21;
LAB_00110888:
  pcStack_250 = (code *)0x11088d;
  secp256k1_ellswift_elligatorswift_var_cold_2();
  puVar16 = puVar22;
LAB_0011088d:
  pcStack_250 = (code *)0x110892;
  secp256k1_ellswift_elligatorswift_var_cold_13();
LAB_00110892:
  pcStack_250 = secp256k1_ellswift_create;
  secp256k1_ellswift_elligatorswift_var_cold_8();
  uStack_268 = 0xfffffffffffff;
  psStack_278 = a_00;
  psStack_270 = r_00;
  psStack_260 = r_01;
  psStack_258 = a_02;
  pcStack_250 = (code *)puVar16;
  if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
    secp256k1_ellswift_create_cold_6();
  }
  else if (a_01 != (secp256k1_ecmult_gen_context *)0x0) {
    *(undefined1 (*) [16])&(a_01->ge_offset).x.magnitude = (undefined1  [16])0x0;
    (a_01->ge_offset).x.n[3] = 0;
    (a_01->ge_offset).x.n[4] = 0;
    (a_01->ge_offset).x.n[1] = 0;
    (a_01->ge_offset).x.n[2] = 0;
    a_01->built = 0;
    a_01->scalar_offset = 0;
    (a_01->ge_offset).x.n[0] = 0;
    if (ecmult_gen_ctx->built == 0) {
      secp256k1_ellswift_create_cold_4();
      return;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ellswift_create_cold_3();
      return;
    }
    iVar11 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,asStack_3bc,&sStack_378,seckey);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_1();
    }
    secp256k1_fe_normalize_var(&sStack_378.x);
    secp256k1_fe_normalize_var(&sStack_378.y);
    sStack_310.s[0] = 0xd29e1bf5;
    sStack_310.s[1] = 0xf7025f42;
    sStack_310.s[2] = 0x9b024773;
    sStack_310.s[3] = 0x94cb7d5;
    sStack_310.s[4] = 0xe59ed789;
    sStack_310.s[5] = 0x3bc9786;
    sStack_310.s[6] = 0x68335b35;
    sStack_310.s[7] = 0x4e363b53;
    sStack_310.bytes = 0x40;
    secp256k1_sha256_write(&sStack_310,seckey,0x20);
    secp256k1_sha256_write(&sStack_310,"",0x20);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_2();
    }
    if (data != (uchar *)0x0) {
      secp256k1_sha256_write(&sStack_310,data,0x20);
    }
    secp256k1_ellswift_elligatorswift_var((uchar *)a_01,&sStack_2a8,&sStack_378,&sStack_310);
    secp256k1_fe_get_b32((uchar *)((a_01->ge_offset).x.n + 3),&sStack_2a8);
    cVar10 = ((byte)iVar11 ^ 1) - 1;
    auVar28 = ZEXT216(CONCAT11(cVar10,cVar10));
    auVar28 = pshuflw(auVar28,auVar28,0);
    uVar15 = auVar28._0_4_;
    lVar13 = 0;
    do {
      puVar1 = (uint *)((long)(a_01->ge_offset).x.n + lVar13 + -8);
      uVar7 = puVar1[1];
      uVar8 = puVar1[2];
      uVar9 = puVar1[3];
      puVar2 = (uint *)((long)(a_01->ge_offset).x.n + lVar13 + -8);
      *puVar2 = *puVar1 & uVar15;
      puVar2[1] = uVar7 & uVar15;
      puVar2[2] = uVar8 & uVar15;
      puVar2[3] = uVar9 & uVar15;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    return;
  }
  secp256k1_ellswift_create_cold_5();
  return;
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}